

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O1

void __thiscall QFontDialogPrivate::setVisible(QFontDialogPrivate *this,bool visible)

{
  QWidget *this_00;
  char cVar1;
  
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  cVar1 = (**(code **)(*(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate + 0xa8))();
  if (cVar1 != '\0') {
    QDialogPrivate::setNativeDialogVisible(&this->super_QDialogPrivate,visible);
  }
  QWidget::setAttribute(this_00,WA_DontShowOnScreen,(this->super_QDialogPrivate).nativeDialogInUse);
  QDialogPrivate::setVisible(&this->super_QDialogPrivate,visible);
  return;
}

Assistant:

void QFontDialogPrivate::setVisible(bool visible)
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const auto q = static_cast<QDialog *>(q_ptr);

    if (canBeNativeDialog())
        setNativeDialogVisible(visible);
    if (nativeDialogInUse) {
        // Set WA_DontShowOnScreen so that QDialog::setVisible(visible) below
        // updates the state correctly, but skips showing the non-native version:
        q->setAttribute(Qt::WA_DontShowOnScreen, true);
    } else {
        q->setAttribute(Qt::WA_DontShowOnScreen, false);
    }
    QDialogPrivate::setVisible(visible);
}